

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_announce_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  bool bVar1;
  index_type iVar2;
  session_settings *this_00;
  duration<int,_std::ratio<1L,_1L>_> *pdVar3;
  undefined8 uVar4;
  pointer pvVar5;
  pointer pvVar6;
  char *pcVar7;
  element_type *peVar8;
  tracker_request *ptVar9;
  span<const_char> sVar10;
  address local_248;
  list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *local_228;
  list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *local_218;
  basic_endpoint<boost::asio::ip::tcp> *local_210;
  basic_endpoint<boost::asio::ip::tcp> *local_208;
  undefined1 local_200 [8];
  list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ip_list;
  value_type local_1d4;
  ipv4_peer_entry e_1;
  int i_1;
  undefined1 auStack_1b8 [8];
  ipv6_peer_entry e;
  int i;
  shared_ptr<libtorrent::aux::request_callback> cb;
  int local_188;
  seconds32 local_184;
  int local_180;
  seconds32 local_17c;
  error_code local_178;
  size_type local_168;
  index_type num_peers;
  int ip_stride;
  int local_154;
  duration<int,_std::ratio<1L,_1L>_> local_150 [4];
  int32_t local_140;
  duration<int,_std::ratio<1L,_1L>_> local_13c;
  undefined1 local_138 [8];
  tracker_response resp;
  char *pcStack_38;
  udp_tracker_connection *this_local;
  span<const_char> buf_local;
  bool local_9;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (udp_tracker_connection *)buf.m_ptr;
  iVar2 = span<const_char>::size((span<const_char> *)&this_local);
  if (iVar2 < 0x14) {
    local_9 = false;
  }
  else {
    join_0x00000010_0x00000000_ = span<const_char>::subspan((span<const_char> *)&this_local,8);
    this_local = (udp_tracker_connection *)resp._240_8_;
    buf_local.m_ptr = pcStack_38;
    timeout_handler::restart_read_timeout((timeout_handler *)this);
    tracker_response::tracker_response((tracker_response *)local_138);
    local_140 = read_int32<char_const>((span<const_char> *)&this_local);
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)&local_13c,&local_140);
    this_00 = tracker_manager::settings((this->super_tracker_connection).m_man);
    local_154 = session_settings::get_int(this_00,0x4037);
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)local_150,&local_154);
    pdVar3 = ::std::max<std::chrono::duration<int,std::ratio<1l,1l>>>(&local_13c,local_150);
    resp.warning_message.field_2._8_4_ = pdVar3->__r;
    num_peers._4_4_ = 0x3c;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)&ip_stride,(int *)((long)&num_peers + 4));
    resp.warning_message.field_2._12_4_ = ip_stride;
    resp.min_interval.__r = read_int32<char_const>((span<const_char> *)&this_local);
    resp.interval.__r = read_int32<char_const>((span<const_char> *)&this_local);
    bVar1 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(&this->m_target);
    num_peers._0_4_ = 6;
    if (bVar1) {
      num_peers._0_4_ = 0x12;
    }
    iVar2 = span<const_char>::size((span<const_char> *)&this_local);
    local_168 = iVar2 / (long)(int)num_peers;
    iVar2 = span<const_char>::size((span<const_char> *)&this_local);
    if (iVar2 % (long)(int)num_peers == 0) {
      tracker_connection::requester((tracker_connection *)&e.port);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&e.port);
      if (bVar1) {
        peVar8 = ::std::
                 __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&e.port);
        tracker_connection::tracker_req(&this->super_tracker_connection);
        uVar4 = ::std::__cxx11::string::c_str();
        (*peVar8->_vptr_request_callback[7])(peVar8,"<== UDP_TRACKER_RESPONSE [ url: %s ]",uVar4);
      }
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&e.port);
      if (bVar1) {
        bVar1 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(&this->m_target);
        if (bVar1) {
          ::std::
          vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
          ::reserve((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                     *)&resp.peers4.
                        super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_168);
          e.ip._M_elems[0xc] = '\0';
          e.ip._M_elems[0xd] = '\0';
          e.ip._M_elems[0xe] = '\0';
          e.ip._M_elems[0xf] = '\0';
          for (; (long)(int)e.ip._M_elems._12_4_ < (long)local_168;
              e.ip._M_elems._12_4_ = e.ip._M_elems._12_4_ + 1) {
            auStack_1b8[0] = '\0';
            auStack_1b8[1] = '\0';
            auStack_1b8[2] = '\0';
            auStack_1b8[3] = '\0';
            auStack_1b8[4] = '\0';
            auStack_1b8[5] = '\0';
            auStack_1b8[6] = '\0';
            auStack_1b8[7] = '\0';
            e.ip._M_elems[0] = '\0';
            e.ip._M_elems[1] = '\0';
            e.ip._M_elems[2] = '\0';
            e.ip._M_elems[3] = '\0';
            e.ip._M_elems[4] = '\0';
            e.ip._M_elems[5] = '\0';
            e.ip._M_elems[6] = '\0';
            e.ip._M_elems[7] = '\0';
            e.ip._M_elems[8] = '\0';
            e.ip._M_elems[9] = '\0';
            pvVar5 = ::std::array<unsigned_char,_16UL>::data
                               ((array<unsigned_char,_16UL> *)auStack_1b8);
            pcVar7 = span<const_char>::data((span<const_char> *)&this_local);
            uVar4 = *(undefined8 *)(pcVar7 + 8);
            *(undefined8 *)pvVar5 = *(undefined8 *)pcVar7;
            *(undefined8 *)(pvVar5 + 8) = uVar4;
            sVar10 = span<const_char>::subspan((span<const_char> *)&this_local,0x10);
            buf_local.m_ptr = (char *)sVar10.m_len;
            register0x00000000 = (udp_tracker_connection *)sVar10.m_ptr;
            this_local = register0x00000000;
            e.ip._M_elems._8_2_ = read_uint16<char_const>((span<const_char> *)&this_local);
            ::std::
            vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
            ::push_back((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                         *)&resp.peers4.
                            super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (value_type *)auStack_1b8);
          }
        }
        else {
          ::std::
          vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
          ::reserve((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                     *)&resp.peers.
                        super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_168);
          e_1.ip._M_elems[0] = '\0';
          e_1.ip._M_elems[1] = '\0';
          e_1.ip._M_elems[2] = '\0';
          e_1.ip._M_elems[3] = '\0';
          for (; (long)(int)e_1.ip._M_elems < (long)local_168; e_1.ip._M_elems = e_1.ip._M_elems + 1
              ) {
            local_1d4.port = 0;
            local_1d4.ip._M_elems[0] = '\0';
            local_1d4.ip._M_elems[1] = '\0';
            local_1d4.ip._M_elems[2] = '\0';
            local_1d4.ip._M_elems[3] = '\0';
            pvVar6 = ::std::array<unsigned_char,_4UL>::data(&local_1d4.ip);
            pcVar7 = span<const_char>::data((span<const_char> *)&this_local);
            *(undefined4 *)pvVar6 = *(undefined4 *)pcVar7;
            sVar10 = span<const_char>::subspan((span<const_char> *)&this_local,4);
            buf_local.m_ptr = (char *)sVar10.m_len;
            ip_list.
            super__List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
            _M_impl._M_node._M_size = (size_t)sVar10.m_ptr;
            this_local = (udp_tracker_connection *)
                         ip_list.
                         super__List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                         ._M_impl._M_node._M_size;
            local_1d4.port = read_uint16<char_const>((span<const_char> *)&this_local);
            ::std::
            vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
            ::push_back((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                         *)&resp.peers.
                            super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d4);
          }
        }
        ::std::__cxx11::list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
        list((list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)local_200)
        ;
        local_208 = (basic_endpoint<boost::asio::ip::tcp> *)
                    ::std::
                    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                    ::begin(&this->m_endpoints);
        local_210 = (basic_endpoint<boost::asio::ip::tcp> *)
                    ::std::
                    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                    ::end(&this->m_endpoints);
        local_218 = (list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                    ::std::
                    back_inserter<std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>>
                              ((list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                                *)local_200);
        local_228 = (list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                    ::std::
                    transform<__gnu_cxx::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>>,std::back_insert_iterator<std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>>,libtorrent::aux::udp_tracker_connection::on_announce_response(libtorrent::span<char_const>)::__0>
                              (local_208,local_210,local_218);
        peVar8 = ::std::
                 __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&e.port);
        ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
        boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address(&local_248,&this->m_target);
        (*peVar8->_vptr_request_callback[4])(peVar8,ptVar9,&local_248,local_200,local_138);
        (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])();
        ::std::__cxx11::list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
        ~list((list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)local_200
             );
      }
      else {
        (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])();
      }
      local_9 = true;
      ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
                ((shared_ptr<libtorrent::aux::request_callback> *)&e.port);
    }
    else {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_178,invalid_tracker_response_length,(type *)0x0);
      local_180 = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_17c,&local_180);
      local_188 = 0x1e;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_184,&local_188);
      fail(this,&local_178,bittorrent,"",local_17c,local_184);
      local_9 = false;
    }
    tracker_response::~tracker_response((tracker_response *)local_138);
  }
  return local_9;
}

Assistant:

bool udp_tracker_connection::on_announce_response(span<char const> buf)
	{
		if (buf.size() < 20) return false;

		buf = buf.subspan(8);
		restart_read_timeout();

		tracker_response resp;

		resp.interval = std::max(seconds32(aux::read_int32(buf))
				, seconds32(m_man.settings().get_int(settings_pack::min_announce_interval)));
		resp.min_interval = seconds32(60);
		resp.incomplete = aux::read_int32(buf);
		resp.complete = aux::read_int32(buf);

		int const ip_stride = aux::is_v6(m_target) ? 18 : 6;
		auto const num_peers = buf.size() / ip_stride;
		if (buf.size() % ip_stride != 0)
		{
			fail(error_code(errors::invalid_tracker_response_length), operation_t::bittorrent);
			return false;
		}

		std::shared_ptr<request_callback> cb = requester();
#ifndef TORRENT_DISABLE_LOGGING
		if (cb)
		{
			cb->debug_log("<== UDP_TRACKER_RESPONSE [ url: %s ]", tracker_req().url.c_str());
		}
#endif

		if (!cb)
		{
			close();
			return true;
		}

		if (aux::is_v6(m_target))
		{
			resp.peers6.reserve(static_cast<std::size_t>(num_peers));
			for (int i = 0; i < num_peers; ++i)
			{
				ipv6_peer_entry e{};
				std::memcpy(e.ip.data(), buf.data(), 16);
				buf = buf.subspan(16);
				e.port = aux::read_uint16(buf);
				resp.peers6.push_back(e);
			}
		}
		else
		{
			resp.peers4.reserve(static_cast<std::size_t>(num_peers));
			for (int i = 0; i < num_peers; ++i)
			{
				ipv4_peer_entry e{};
				std::memcpy(e.ip.data(), buf.data(), 4);
				buf = buf.subspan(4);
				e.port = aux::read_uint16(buf);
				resp.peers4.push_back(e);
			}
		}

		// TODO: why is this a linked list?
		std::list<address> ip_list;
		std::transform(m_endpoints.begin(), m_endpoints.end(), std::back_inserter(ip_list)
			, [](tcp::endpoint const& ep) { return ep.address(); } );

		cb->tracker_response(tracker_req(), m_target.address(), ip_list, resp);

		close();
		return true;
	}